

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O2

void __thiscall RegionChecker::RegionChecker(RegionChecker *this,istream *file)

{
  bool bVar1;
  int_type iVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> iter;
  allocator_type local_61;
  _Bvector_base<std::allocator<bool>_> local_60;
  istreambuf_iterator<char,_std::char_traits<char>_> local_38;
  
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  std::istream::seekg((long)file,_S_beg);
  local_38._M_sbuf = *(streambuf_type **)(file + *(long *)(*(long *)file + -0x18) + 0xe8);
  local_38._M_c = -1;
  while( true ) {
    local_60._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_60._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
         0xffffffff;
    bVar1 = std::operator!=(&local_38,
                            (istreambuf_iterator<char,_std::char_traits<char>_> *)&local_60);
    if (!bVar1) break;
    iVar2 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(&local_38);
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->fileUsage,(char)iVar2 != '\0');
    std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_38,0);
  }
  std::istream::seekg((long)file,_S_beg);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_60,
             (ulong)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (long)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,&local_61);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&this->usedBits,(vector<bool,_std::allocator<bool>_> *)&local_60);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_60);
  return;
}

Assistant:

RegionChecker::RegionChecker(std::istream &file) {
	file.seekg(0, file.beg);
	std::istreambuf_iterator<char> iter(file);
	while (iter != std::istreambuf_iterator<char>()) {
		fileUsage.push_back(*iter != 0);
		iter++;
	}
	file.seekg(0, file.beg);
	usedBits = std::vector<bool>(fileUsage.size());
}